

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr.cpp
# Opt level: O2

void __thiscall pg::RRSolver::run(RRSolver *this)

{
  Game *pGVar1;
  int *piVar2;
  bitset *pbVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong *puVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  ostream *poVar15;
  int i;
  uint p;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint i_00;
  uint uVar19;
  ulong uVar20;
  
  pGVar1 = (this->super_PPSolver).super_Solver.game;
  uVar16 = pGVar1->n_vertices;
  piVar2 = pGVar1->_priority;
  iVar8 = *(int *)((long)piVar2 + ((long)((uVar16 << 0x20) + -0x100000000) >> 0x1e));
  uVar20 = (ulong)(iVar8 + 1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar20;
  uVar10 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar17 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar17 = 0xffffffffffffffff;
  }
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar11 = (ulong *)operator_new__(uVar17);
  *puVar11 = uVar20;
  if (iVar8 != -1) {
    memset((vector<int,_std::allocator<int>_> *)(puVar11 + 1),0,
           ((uVar10 - 0x18) - (uVar10 - 0x18) % 0x18) + 0x18);
  }
  (this->super_PPSolver).regions = (vector<int,_std::allocator<int>_> *)(puVar11 + 1);
  uVar17 = -(ulong)(uVar16 >> 0x3e != 0) | uVar16 * 4;
  piVar12 = (int *)operator_new__(uVar17);
  (this->super_PPSolver).region = piVar12;
  piVar13 = (int *)operator_new__(uVar17);
  (this->super_PPSolver).strategy = piVar13;
  uVar17 = uVar20 << 2;
  if (iVar8 < -1) {
    uVar17 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar17);
  (this->super_PPSolver).inverse = piVar14;
  pbVar3 = (this->super_PPSolver).super_Solver.disabled;
  uVar17 = ~((long)uVar16 >> 0x3f) & uVar16;
  for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
    iVar8 = -2;
    if ((pbVar3->_bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) {
      iVar8 = piVar2[uVar10];
    }
    piVar12[uVar10] = iVar8;
  }
  for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
    piVar13[uVar10] = -1;
  }
  (this->super_PPSolver).promotions = 0;
  i_00 = (int)uVar16 - 1;
LAB_00152ab3:
  do {
    if ((int)i_00 < 0) {
LAB_00152c27:
      pvVar4 = (this->super_PPSolver).regions;
      if (pvVar4 != (vector<int,_std::allocator<int>_> *)0x0) {
        piVar5 = pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (piVar5 != (pointer)0x0) {
          lVar18 = (long)piVar5 * 0x18;
          do {
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)
                       ((long)&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != 0);
        }
        operator_delete__(&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)piVar5 * 0x18 + 8);
      }
      piVar2 = (this->super_PPSolver).region;
      if (piVar2 != (int *)0x0) {
        operator_delete__(piVar2);
      }
      piVar2 = (this->super_PPSolver).strategy;
      if (piVar2 != (int *)0x0) {
        operator_delete__(piVar2);
      }
      piVar2 = (this->super_PPSolver).inverse;
      if (piVar2 != (int *)0x0) {
        operator_delete__(piVar2);
      }
      poVar15 = std::operator<<((this->super_PPSolver).super_Solver.logger,"solved with ");
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,(this->super_PPSolver).promotions);
      poVar15 = std::operator<<(poVar15," promotions.");
      std::endl<char,std::char_traits<char>>(poVar15);
      return;
    }
    piVar2 = ((this->super_PPSolver).super_Solver.game)->_priority;
    p = piVar2[i_00];
    while( true ) {
      if ((int)i_00 < 0) goto LAB_00152c27;
      uVar16 = (ulong)i_00;
      if (piVar2[uVar16] != p) {
        pvVar4 = (this->super_PPSolver).regions;
        if (pvVar4[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            pvVar4[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          PPSolver::resetRegion(&this->super_PPSolver,p);
        }
        goto LAB_00152ab3;
      }
      if (((((this->super_PPSolver).super_Solver.disabled)->_bits[i_00 >> 6] >> (uVar16 & 0x3f) & 1)
           == 0) && ((this->super_PPSolver).region[uVar16] <= (int)p)) break;
      i_00 = i_00 - 1;
    }
    (this->super_PPSolver).inverse[(int)p] = i_00;
    iVar8 = (*(this->super_PPSolver).super_Solver._vptr_Solver[5])(this,(ulong)p);
    bVar7 = PPSolver::setupRegion(&this->super_PPSolver,i_00,p,(bool)((byte)iVar8 ^ 1));
    if (!bVar7) {
      for (uVar9 = i_00;
          (i_00 = 0xffffffff, -1 < (int)uVar9 &&
          (i_00 = uVar9, ((this->super_PPSolver).super_Solver.game)->_priority[uVar9] == p));
          uVar9 = uVar9 - 1) {
      }
      goto LAB_00152ab3;
    }
    while( true ) {
      uVar16 = (ulong)i_00;
      if (1 < (this->super_PPSolver).super_Solver.trace) {
        PPSolver::reportRegion(&this->super_PPSolver,p);
      }
      uVar9 = (*(this->super_PPSolver).super_Solver._vptr_Solver[4])(this,uVar16,(ulong)p);
      if (uVar9 == 0xffffffff) {
        PPSolver::setDominion(&this->super_PPSolver,p);
        i_00 = (int)((this->super_PPSolver).super_Solver.game)->n_vertices - 1;
        goto LAB_00152ab3;
      }
      if (uVar9 == 0xfffffffe) break;
      if (1 < (this->super_PPSolver).super_Solver.trace) {
        PPSolver::printState(&this->super_PPSolver);
      }
      PPSolver::promote(&this->super_PPSolver,p,uVar9);
      if (1 < (this->super_PPSolver).super_Solver.trace) {
        PPSolver::printState(&this->super_PPSolver);
      }
      i_00 = (this->super_PPSolver).inverse[(int)uVar9];
      p = uVar9;
    }
    uVar9 = 0xffffffff;
    if ((int)i_00 < -1) {
      uVar9 = i_00;
    }
    while ((uVar19 = (uint)uVar16, i_00 = uVar9, -1 < (int)uVar19 &&
           (i_00 = uVar19, ((this->super_PPSolver).super_Solver.game)->_priority[uVar16] == p))) {
      uVar16 = (ulong)(uVar19 - 1);
    }
  } while( true );
}

Assistant:

void
RRSolver::run()
{
    // obtain highest priority and allocate arrays
    int max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // RR: only reset the region if:
        // - current node is promoted or attracted
        // - or region is empty
        // - or region does not fulfill conditions
        // This is checked by checkRegion()
        if (setupRegion(i, p, !checkRegion(p))) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion, return
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    break;
                } else {
                    // found promotion, promote
                    if (trace >= 2) printState();
                    promote(p, res);
                    if (trace >= 2) printState();
                    // continue inner loop with the higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}